

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmGeneratorTarget::ConstructSourceFileFlags(cmGeneratorTarget *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_01;
  bool bVar1;
  uint uVar2;
  string *psVar3;
  mapped_type *pmVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  SourceFileFlags *flags_2;
  cmSourceFile *sf_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *relFile_2;
  iterator __end2_2;
  iterator __begin2_2;
  cmList *__range2_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  iterator local_1d8;
  size_type local_1d0;
  undefined1 local_1c8 [8];
  cmList relFiles_2;
  string local_1a8;
  cmValue local_188;
  cmValue files_2;
  SourceFileFlags *flags_1;
  cmSourceFile *sf_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *relFile_1;
  iterator __end2_1;
  iterator __begin2_1;
  cmList *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  iterator local_128;
  size_type local_120;
  undefined1 local_118 [8];
  cmList relFiles_1;
  string local_f8;
  cmValue local_d8;
  cmValue files_1;
  SourceFileFlags *flags;
  cmSourceFile *sf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *relFile;
  iterator __end2;
  iterator __begin2;
  cmList *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  iterator local_78;
  size_type local_70;
  undefined1 local_68 [8];
  cmList relFiles;
  allocator<char> local_39;
  string local_38;
  cmValue local_18;
  cmValue files;
  cmGeneratorTarget *this_local;
  
  if ((this->SourceFileFlagsConstructed & 1U) == 0) {
    this->SourceFileFlagsConstructed = true;
    files.Value = (string *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"PUBLIC_HEADER",&local_39);
    local_18 = GetProperty(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    bVar1 = cmValue::operator_cast_to_bool(&local_18);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_18);
      std::__cxx11::string::string((string *)&local_98,(string *)psVar3);
      local_78 = &local_98;
      local_70 = 1;
      init_01._M_len = 1;
      init_01._M_array = local_78;
      cmList::cmList((cmList *)local_68,init_01);
      local_258 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78;
      do {
        local_258 = local_258 + -1;
        std::__cxx11::string::~string((string *)local_258);
      } while (local_258 != &local_98);
      __end2 = cmList::begin_abi_cxx11_((cmList *)local_68);
      relFile = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                cmList::end_abi_cxx11_((cmList *)local_68);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&relFile), bVar1) {
        sf = (cmSourceFile *)
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
        flags = (SourceFileFlags *)cmMakefile::GetSource(this->Makefile,(string *)sf,Ambiguous);
        if ((cmSourceFile *)flags != (cmSourceFile *)0x0) {
          files_1.Value =
               (string *)
               std::
               map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
               ::operator[](&this->SourceFlagsMap,(key_type *)&flags);
          (files_1.Value)->_M_string_length = (size_type)"Headers";
          *(undefined4 *)files_1.Value = 2;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      cmList::~cmList((cmList *)local_68);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"PRIVATE_HEADER",
               (allocator<char> *)
               ((long)&relFiles_1.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_d8 = GetProperty(this,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&relFiles_1.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    bVar1 = cmValue::operator_cast_to_bool(&local_d8);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_d8);
      std::__cxx11::string::string((string *)&local_148,(string *)psVar3);
      local_128 = &local_148;
      local_120 = 1;
      init_00._M_len = 1;
      init_00._M_array = local_128;
      cmList::cmList((cmList *)local_118,init_00);
      local_2c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128;
      do {
        local_2c0 = local_2c0 + -1;
        std::__cxx11::string::~string((string *)local_2c0);
      } while (local_2c0 != &local_148);
      __end2_1 = cmList::begin_abi_cxx11_((cmList *)local_118);
      relFile_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  cmList::end_abi_cxx11_((cmList *)local_118);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&relFile_1), bVar1) {
        sf_1 = (cmSourceFile *)
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2_1);
        flags_1 = (SourceFileFlags *)cmMakefile::GetSource(this->Makefile,(string *)sf_1,Ambiguous);
        if ((cmSourceFile *)flags_1 != (cmSourceFile *)0x0) {
          files_2.Value =
               (string *)
               std::
               map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
               ::operator[](&this->SourceFlagsMap,(key_type *)&flags_1);
          (files_2.Value)->_M_string_length = (size_type)"PrivateHeaders";
          *(undefined4 *)files_2.Value = 1;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2_1);
      }
      cmList::~cmList((cmList *)local_118);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"RESOURCE",
               (allocator<char> *)
               ((long)&relFiles_2.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_188 = GetProperty(this,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&relFiles_2.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    bVar1 = cmValue::operator_cast_to_bool(&local_188);
    if (bVar1) {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_188);
      std::__cxx11::string::string((string *)&local_1f8,(string *)psVar3);
      local_1d8 = &local_1f8;
      local_1d0 = 1;
      init._M_len = 1;
      init._M_array = local_1d8;
      cmList::cmList((cmList *)local_1c8,init);
      local_328 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8;
      do {
        local_328 = local_328 + -1;
        std::__cxx11::string::~string((string *)local_328);
      } while (local_328 != &local_1f8);
      __end2_2 = cmList::begin_abi_cxx11_((cmList *)local_1c8);
      relFile_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  cmList::end_abi_cxx11_((cmList *)local_1c8);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_2,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&relFile_2), bVar1) {
        sf_2 = (cmSourceFile *)
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2_2);
        flags_2 = (SourceFileFlags *)cmMakefile::GetSource(this->Makefile,(string *)sf_2,Ambiguous);
        if ((cmSourceFile *)flags_2 != (cmSourceFile *)0x0) {
          pmVar4 = std::
                   map<const_cmSourceFile_*,_cmGeneratorTarget::SourceFileFlags,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceFileFlags>_>_>
                   ::operator[](&this->SourceFlagsMap,(key_type *)&flags_2);
          pmVar4->MacFolder = "";
          uVar2 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x32])
                            (this->GlobalGenerator,this->Makefile);
          if ((uVar2 & 1) == 0) {
            pmVar4->MacFolder = "Resources";
          }
          pmVar4->Type = SourceFileTypeResource;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2_2);
      }
      cmList::~cmList((cmList *)local_1c8);
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::ConstructSourceFileFlags() const
{
  if (this->SourceFileFlagsConstructed) {
    return;
  }
  this->SourceFileFlagsConstructed = true;

  // Process public headers to mark the source files.
  if (cmValue files = this->GetProperty("PUBLIC_HEADER")) {
    cmList relFiles{ *files };
    for (auto const& relFile : relFiles) {
      if (cmSourceFile* sf = this->Makefile->GetSource(relFile)) {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "Headers";
        flags.Type = cmGeneratorTarget::SourceFileTypePublicHeader;
      }
    }
  }

  // Process private headers after public headers so that they take
  // precedence if a file is listed in both.
  if (cmValue files = this->GetProperty("PRIVATE_HEADER")) {
    cmList relFiles{ *files };
    for (auto const& relFile : relFiles) {
      if (cmSourceFile* sf = this->Makefile->GetSource(relFile)) {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "PrivateHeaders";
        flags.Type = cmGeneratorTarget::SourceFileTypePrivateHeader;
      }
    }
  }

  // Mark sources listed as resources.
  if (cmValue files = this->GetProperty("RESOURCE")) {
    cmList relFiles{ *files };
    for (auto const& relFile : relFiles) {
      if (cmSourceFile* sf = this->Makefile->GetSource(relFile)) {
        SourceFileFlags& flags = this->SourceFlagsMap[sf];
        flags.MacFolder = "";
        if (!this->GlobalGenerator->ShouldStripResourcePath(this->Makefile)) {
          flags.MacFolder = "Resources";
        }
        flags.Type = cmGeneratorTarget::SourceFileTypeResource;
      }
    }
  }
}